

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

void google::protobuf::internal::WireFormatLite::WriteSInt32
               (int field_number,int32 value,CodedOutputStream *output)

{
  bool bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  uint uVar4;
  uint uVar5;
  byte *pbVar6;
  
  uVar5 = field_number << 3;
  if ((output->impl_).end_ <= output->cur_) {
    puVar3 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,output->cur_);
    output->cur_ = puVar3;
  }
  pbVar6 = output->cur_;
  if (uVar5 < 0x80) {
    *pbVar6 = (byte)uVar5;
    pbVar6 = pbVar6 + 1;
  }
  else {
    *pbVar6 = (byte)uVar5 | 0x80;
    if (uVar5 < 0x4000) {
      pbVar6[1] = (byte)(uVar5 >> 7);
      pbVar6 = pbVar6 + 2;
    }
    else {
      pbVar6 = pbVar6 + 2;
      uVar5 = uVar5 >> 7;
      do {
        pbVar2 = pbVar6;
        pbVar2[-1] = (byte)uVar5 | 0x80;
        uVar4 = uVar5 >> 7;
        pbVar6 = pbVar2 + 1;
        bVar1 = 0x3fff < uVar5;
        uVar5 = uVar4;
      } while (bVar1);
      *pbVar2 = (byte)uVar4;
    }
  }
  output->cur_ = pbVar6;
  uVar5 = value >> 0x1f ^ value * 2;
  if ((output->impl_).end_ <= pbVar6) {
    puVar3 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar6);
    output->cur_ = puVar3;
  }
  pbVar6 = output->cur_;
  if (uVar5 < 0x80) {
    *pbVar6 = (byte)uVar5;
    pbVar6 = pbVar6 + 1;
  }
  else {
    *pbVar6 = (byte)uVar5 | 0x80;
    if (uVar5 < 0x4000) {
      pbVar6[1] = (byte)(uVar5 >> 7);
      pbVar6 = pbVar6 + 2;
    }
    else {
      pbVar6 = pbVar6 + 2;
      uVar5 = uVar5 >> 7;
      do {
        pbVar2 = pbVar6;
        pbVar2[-1] = (byte)uVar5 | 0x80;
        uVar4 = uVar5 >> 7;
        pbVar6 = pbVar2 + 1;
        bVar1 = 0x3fff < uVar5;
        uVar5 = uVar4;
      } while (bVar1);
      *pbVar2 = (byte)uVar4;
    }
  }
  output->cur_ = pbVar6;
  return;
}

Assistant:

void WireFormatLite::WriteSInt32(int field_number, int32 value,
                                 io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_VARINT, output);
  WriteSInt32NoTag(value, output);
}